

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::subtree_ref_base<true>::find_insert_point
          (subtree_ref_base<true> *this,size_t index)

{
  ulong uVar1;
  word_type wVar2;
  size_t sVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  sbyte sVar7;
  ulong uVar8;
  ulong uVar9;
  word_type wVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  ulong uVar16;
  long lVar17;
  bt_impl_t *pbVar18;
  ulong uVar19;
  ulong uVar20;
  pair<unsigned_long,_unsigned_long> pVar21;
  
  pbVar18 = this->_vector;
  uVar20 = 0;
  uVar14 = (pbVar18->sizes)._width;
  uVar12 = pbVar18->degree;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar14;
  uVar8 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40)) / auVar5,0);
  uVar13 = uVar12 % uVar8;
  if (uVar12 != 0) {
    wVar2 = (pbVar18->sizes)._field_mask;
    sVar3 = pbVar18->counter_width;
    uVar16 = wVar2 << ((ulong)(byte)((char)uVar14 - 1) & 0x3f);
    uVar14 = uVar12;
    uVar9 = 0;
    uVar20 = uVar12;
    do {
      uVar4 = (pbVar18->sizes)._width;
      uVar19 = uVar8;
      if (uVar14 < uVar8) {
        uVar19 = uVar13;
      }
      lVar11 = uVar12 * this->_index;
      uVar1 = uVar19 + uVar9;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar4;
      lVar17 = uVar9 + lVar11;
      uVar12 = lVar11 + uVar1;
      uVar9 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40)) / auVar6,0) + lVar17;
      if (uVar9 < uVar12) {
        uVar12 = uVar9;
      }
      wVar10 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
               get(&(pbVar18->sizes)._bits,lVar17 * uVar4,uVar12 * uVar4);
      lVar17 = uVar19 * sVar3;
      bVar15 = 0x40 - (-(char)lVar17 & 0x3fU);
      sVar7 = (bVar15 < 0x41) * ('@' - bVar15);
      pbVar18 = this->_vector;
      lVar11 = POPCOUNT(((wVar10 | uVar16) - wVar2 * index << sVar7) >> sVar7 & uVar16);
      if (lVar17 == 0) {
        lVar11 = 0;
      }
      uVar14 = uVar14 - uVar19;
      uVar20 = uVar20 - lVar11;
      uVar12 = pbVar18->degree;
      uVar9 = uVar1;
    } while (uVar1 < uVar12);
    if (uVar20 == 0) {
      uVar20 = 0;
    }
    else {
      lVar11 = uVar12 * this->_index;
      sVar3 = (pbVar18->sizes)._width;
      wVar10 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
               get(&(pbVar18->sizes)._bits,(lVar11 + -1 + uVar20) * sVar3,(lVar11 + uVar20) * sVar3)
      ;
      index = index - wVar10;
    }
  }
  pVar21.second = index;
  pVar21.first = uVar20;
  return pVar21;
}

Assistant:

std::pair<size_t, size_t>
            find_insert_point(size_t index) const
            {
                assert(is_node());
                
                using word_type = typename packed_data::word_type;
                
                size_t len = degree();
                const word_type field_mask   = _vector.sizes.field_mask();
                const word_type flag_mask    = _vector.sizes.flag_mask();
                const size_t width           = _vector.counter_width;
                const size_t fields_per_word = _vector.sizes.elements_per_word();
                const size_t rem             = len % fields_per_word;
                
                ensure_bitsize(index, width - 1);
                
                size_t child = len;
                for(size_t step, p = 0; p < degree(); len -= step, p += step)
                {
                    step = len < fields_per_word ? rem : fields_per_word;
                    
                    word_type word = word_type(sizes(p, p + step)) |
                                     flag_mask;
                    
                    child -= popcount(lowbits(flag_mask &
                                              (word - index * field_mask),
                                              step * width));
                }
                
                assert(len == 0);
                
                size_t new_index = index;
                if(child > 0)
                    new_index -= sizes(child - 1);
                
                return { child, new_index };
            }